

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_geom_topo(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  byte local_41;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL node1_has_jump;
  REF_BOOL node0_has_jump;
  REF_GEOM ref_geom;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  _node1_has_jump = ref_grid->geom;
  *allowed = 0;
  ref_geom = (REF_GEOM)allowed;
  allowed_local._0_4_ = node1;
  allowed_local._4_4_ = node0;
  _node1_local = ref_grid;
  uVar1 = ref_geom_has_jump(_node1_has_jump,node0,&ref_private_macro_code_rss);
  if (uVar1 == 0) {
    ref_grid_local._4_4_ =
         ref_geom_has_jump(_node1_has_jump,(REF_INT)allowed_local,&ref_private_macro_code_rss_1);
    if (ref_grid_local._4_4_ == 0) {
      local_41 = 0;
      if (ref_private_macro_code_rss == 0) {
        local_41 = ref_private_macro_code_rss_1 != 0 ^ 0xff;
      }
      ref_geom->n = (uint)(local_41 & 1);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x1d2,
             "ref_swap_geom_topo",(ulong)ref_grid_local._4_4_,"n1 jump");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x1d1,
           "ref_swap_geom_topo",(ulong)uVar1,"n0 jump");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_geom_topo(REF_GRID ref_grid, REF_INT node0,
                                      REF_INT node1, REF_BOOL *allowed) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_BOOL node0_has_jump, node1_has_jump;

  *allowed = REF_FALSE;

  RSS(ref_geom_has_jump(ref_geom, node0, &node0_has_jump), "n0 jump");
  RSS(ref_geom_has_jump(ref_geom, node1, &node1_has_jump), "n1 jump");

  *allowed = !node0_has_jump && !node1_has_jump;

  return REF_SUCCESS;
}